

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglColorClearCase.cpp
# Opt level: O1

void deqp::egl::readPixels(EGLint api,ApiFunctions *func,Surface *dst)

{
  if (api < 4) {
    if (api == 1) {
      gles1::readPixels(dst,0,0,dst->m_width,dst->m_height);
      return;
    }
    if (api == 2) {
      vg::readPixels(dst,0,0,dst->m_width,dst->m_height);
      return;
    }
  }
  else if ((api == 4) || (api == 0x40)) {
    gles2::readPixels(&func->gl,dst,0,0,dst->m_width,dst->m_height);
    return;
  }
  return;
}

Assistant:

static void readPixels (EGLint api, const ApiFunctions& func, tcu::Surface& dst)
{
	switch (api)
	{
		case EGL_OPENGL_ES_BIT:			gles1::readPixels	(dst, 0, 0, dst.getWidth(), dst.getHeight());			break;
		case EGL_OPENGL_ES2_BIT:		gles2::readPixels	(func.gl, dst, 0, 0, dst.getWidth(), dst.getHeight());	break;
		case EGL_OPENGL_ES3_BIT_KHR:	gles2::readPixels	(func.gl, dst, 0, 0, dst.getWidth(), dst.getHeight());	break;
		case EGL_OPENVG_BIT:			vg::readPixels		(dst, 0, 0, dst.getWidth(), dst.getHeight());			break;
		default:
			DE_ASSERT(DE_FALSE);
	}
}